

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeViewPrivate::calcLogicalIndices
          (QTreeViewPrivate *this,QList<int> *logicalIndices,
          QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions,int left,int right)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  qsizetype qVar5;
  const_reference piVar6;
  reference pVVar7;
  int in_ECX;
  QList<int> *in_RSI;
  long in_RDI;
  int in_R8D;
  ViewItemPosition pos;
  int prevLogicalSection;
  int nextLogicalSection;
  int headerSection;
  int currentLogicalSection;
  int logicalIndex_1;
  int visualIndex_1;
  int logicalIndex;
  int visualIndex;
  int logicalIndexAfterRight;
  int logicalIndexBeforeLeft;
  int columnCount;
  undefined4 in_stack_ffffffffffffff78;
  parameter_type in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  ViewItemPosition in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int iVar8;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar9;
  QList<QStyleOptionViewItem::ViewItemPosition> *in_stack_ffffffffffffff90;
  QHeaderView *in_stack_ffffffffffffff98;
  ViewItemPosition local_50;
  int local_40;
  int local_38;
  int local_30;
  int local_2c;
  int local_28;
  
  iVar2 = QHeaderView::count((QHeaderView *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_28 = -1;
  local_2c = -1;
  local_50 = in_stack_ffffffffffffff84;
  for (local_30 = in_ECX + -1; local_38 = in_ECX, iVar3 = local_28, -1 < local_30;
      local_30 = local_30 + -1) {
    iVar3 = QHeaderView::logicalIndex
                      ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       local_50);
    bVar1 = QHeaderView::isSectionHidden
                      (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    if (!bVar1) break;
  }
  do {
    local_28 = iVar3;
    iVar3 = local_2c;
    if (iVar2 <= local_38) {
LAB_008f66c9:
      local_2c = iVar3;
      QList<int>::size(in_RSI);
      QList<QStyleOptionViewItem::ViewItemPosition>::resize
                (in_stack_ffffffffffffff90,
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_40 = 0;
      while( true ) {
        lVar4 = (long)local_40;
        qVar5 = QList<int>::size(in_RSI);
        if (qVar5 <= lVar4) break;
        piVar6 = QList<int>::at((QList<int> *)CONCAT44(local_50,in_stack_ffffffffffffff80),
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        iVar3 = *piVar6;
        lVar4 = (long)(local_40 + 1);
        qVar5 = QList<int>::size(in_RSI);
        iVar9 = local_2c;
        if (lVar4 < qVar5) {
          piVar6 = QList<int>::at((QList<int> *)CONCAT44(local_50,in_stack_ffffffffffffff80),
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          iVar9 = *piVar6;
        }
        iVar8 = local_28;
        if (-1 < local_40 + -1) {
          piVar6 = QList<int>::at((QList<int> *)CONCAT44(local_50,in_stack_ffffffffffffff80),
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          iVar8 = *piVar6;
        }
        if ((((iVar2 == 1) || ((iVar9 == 0 && (iVar8 == -1)))) || ((iVar3 == 0 && (iVar9 == -1))))
           || ((*(byte *)(in_RDI + 0x5d4) & 1) != 0)) {
          local_50 = OnlyOne;
        }
        else {
          bVar1 = isTreePosition((QTreeViewPrivate *)CONCAT44(local_50,in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7c);
          if ((bVar1) || ((iVar9 != 0 && (iVar8 == -1)))) {
            local_50 = Beginning;
          }
          else if ((iVar9 == 0) || (iVar9 == -1)) {
            local_50 = End;
          }
          else {
            local_50 = Middle;
          }
        }
        pVVar7 = QList<QStyleOptionViewItem::ViewItemPosition>::operator[]
                           ((QList<QStyleOptionViewItem::ViewItemPosition> *)
                            CONCAT44(local_50,in_stack_ffffffffffffff80),
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        *pVVar7 = local_50;
        local_40 = local_40 + 1;
      }
      return;
    }
    iVar3 = QHeaderView::logicalIndex
                      ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       local_50);
    bVar1 = QHeaderView::isSectionHidden
                      (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    if (!bVar1) {
      if (in_R8D < local_38) goto LAB_008f66c9;
      QList<int>::append((QList<int> *)0x8f66ba,in_stack_ffffffffffffff7c);
    }
    local_38 = local_38 + 1;
    iVar3 = local_28;
  } while( true );
}

Assistant:

void QTreeViewPrivate::calcLogicalIndices(
        QList<int> *logicalIndices, QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions,
        int left, int right) const
{
    const int columnCount = header->count();
    /* 'left' and 'right' are the left-most and right-most visible visual indices.
       Compute the first visible logical indices before and after the left and right.
       We will use these values to determine the QStyleOptionViewItem::viewItemPosition. */
    int logicalIndexBeforeLeft = -1, logicalIndexAfterRight = -1;
    for (int visualIndex = left - 1; visualIndex >= 0; --visualIndex) {
        int logicalIndex = header->logicalIndex(visualIndex);
        if (!header->isSectionHidden(logicalIndex)) {
            logicalIndexBeforeLeft = logicalIndex;
            break;
        }
    }

    for (int visualIndex = left; visualIndex < columnCount; ++visualIndex) {
        int logicalIndex = header->logicalIndex(visualIndex);
        if (!header->isSectionHidden(logicalIndex)) {
            if (visualIndex > right) {
                logicalIndexAfterRight = logicalIndex;
                break;
            }
            logicalIndices->append(logicalIndex);
        }
    }

    itemPositions->resize(logicalIndices->size());
    for (int currentLogicalSection = 0; currentLogicalSection < logicalIndices->size(); ++currentLogicalSection) {
        const int headerSection = logicalIndices->at(currentLogicalSection);
        // determine the viewItemPosition depending on the position of column 0
        int nextLogicalSection = currentLogicalSection + 1 >= logicalIndices->size()
                                 ? logicalIndexAfterRight
                                 : logicalIndices->at(currentLogicalSection + 1);
        int prevLogicalSection = currentLogicalSection - 1 < 0
                                 ? logicalIndexBeforeLeft
                                 : logicalIndices->at(currentLogicalSection - 1);
        QStyleOptionViewItem::ViewItemPosition pos;
        if (columnCount == 1 || (nextLogicalSection == 0 && prevLogicalSection == -1)
            || (headerSection == 0 && nextLogicalSection == -1) || spanning)
            pos = QStyleOptionViewItem::OnlyOne;
        else if (isTreePosition(headerSection) || (nextLogicalSection != 0 && prevLogicalSection == -1))
            pos = QStyleOptionViewItem::Beginning;
        else if (nextLogicalSection == 0 || nextLogicalSection == -1)
            pos = QStyleOptionViewItem::End;
        else
            pos = QStyleOptionViewItem::Middle;
        (*itemPositions)[currentLogicalSection] = pos;
    }
}